

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int __thiscall
icu_63::UnicodeString::clone
          (UnicodeString *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  UnicodeString *this_00;
  undefined8 local_30;
  UnicodeString *this_local;
  
  this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)__fn);
  local_30 = (UnicodeString *)0x0;
  if (this_00 != (UnicodeString *)0x0) {
    UnicodeString(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

Replaceable *
UnicodeString::clone() const {
  return new UnicodeString(*this);
}